

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<void_(SDL_Renderer_*)> * __thiscall
testing::internal::FunctionMocker<void_(SDL_Renderer_*)>::With
          (MockSpec<void_(SDL_Renderer_*)> *__return_storage_ptr__,
          FunctionMocker<void_(SDL_Renderer_*)> *this,Matcher<SDL_Renderer_*> *m)

{
  tuple<testing::Matcher<SDL_Renderer_*>_> local_38;
  Matcher<SDL_Renderer_*> *local_20;
  Matcher<SDL_Renderer_*> *m_local;
  FunctionMocker<void_(SDL_Renderer_*)> *this_local;
  
  local_20 = m;
  m_local = (Matcher<SDL_Renderer_*> *)this;
  this_local = (FunctionMocker<void_(SDL_Renderer_*)> *)__return_storage_ptr__;
  std::make_tuple<testing::Matcher<SDL_Renderer*>>(&local_38,m);
  MockSpec<void_(SDL_Renderer_*)>::MockSpec(__return_storage_ptr__,this,&local_38);
  std::tuple<testing::Matcher<SDL_Renderer_*>_>::~tuple(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }